

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oscurses.cc
# Opt level: O0

int timedGetcRaw(bool showCursor,int timeout,bool *timedOut)

{
  undefined1 *in_RDX;
  uint in_ESI;
  byte in_DIL;
  int c;
  int local_4;
  
  if (!timedGetcRaw::done) {
    timedGetcRaw::done = true;
    return timedGetcRaw::extKey;
  }
  local_4 = (*globalApp->_vptr_FrobTadsApplication[8])
                      (globalApp,(ulong)(in_DIL & 1),(ulong)in_ESI,in_DIL & 1);
  timedGetcRaw::extKey = 0;
  if (local_4 == -1) {
    if (-1 < (int)in_ESI) {
      if (in_RDX != (undefined1 *)0x0) {
        *in_RDX = 1;
      }
      return 0;
    }
    timedGetcRaw::extKey = 0x20;
  }
  if ((-1 < (int)in_ESI) && (in_RDX != (undefined1 *)0x0)) {
    *in_RDX = 0;
  }
  if (local_4 == 0) {
    timedGetcRaw::extKey = 0x20;
  }
  else {
    if (local_4 == 8) {
      return 8;
    }
    if (local_4 == 9) {
      timedGetcRaw::extKey = 0x1a;
    }
    else {
      if ((local_4 == 10) || (local_4 == 0xd)) {
        return 0xd;
      }
      if (local_4 == 0x102) {
        timedGetcRaw::extKey = 2;
      }
      else if (local_4 == 0x103) {
        timedGetcRaw::extKey = 1;
      }
      else if (local_4 == 0x104) {
        timedGetcRaw::extKey = 4;
      }
      else if (local_4 == 0x105) {
        timedGetcRaw::extKey = 3;
      }
      else if (local_4 == 0x106) {
        timedGetcRaw::extKey = 6;
      }
      else {
        if (local_4 == 0x107) {
          return 8;
        }
        if (local_4 == 0x109) {
          timedGetcRaw::extKey = 0xf;
        }
        else if (local_4 == 0x10a) {
          timedGetcRaw::extKey = 0x10;
        }
        else if (local_4 == 0x10b) {
          timedGetcRaw::extKey = 0x11;
        }
        else if (local_4 == 0x10c) {
          timedGetcRaw::extKey = 0x12;
        }
        else if (local_4 == 0x10d) {
          timedGetcRaw::extKey = 0x13;
        }
        else if (local_4 == 0x10e) {
          timedGetcRaw::extKey = 0x14;
        }
        else if (local_4 == 0x10f) {
          timedGetcRaw::extKey = 0x15;
        }
        else if (local_4 == 0x110) {
          timedGetcRaw::extKey = 0x16;
        }
        else if (local_4 == 0x111) {
          timedGetcRaw::extKey = 0x17;
        }
        else if (local_4 == 0x112) {
          timedGetcRaw::extKey = 0x18;
        }
        else if (local_4 == 0x148) {
          timedGetcRaw::extKey = 8;
        }
        else if (local_4 == 0x14a) {
          timedGetcRaw::extKey = 9;
        }
        else if (local_4 == 0x14f) {
          timedGetcRaw::extKey = 7;
        }
        else if (local_4 == 0x152) {
          timedGetcRaw::extKey = 0xc;
        }
        else if (local_4 == 0x153) {
          timedGetcRaw::extKey = 0xb;
        }
        else {
          if (local_4 == 0x157) {
            return 0xd;
          }
          if (local_4 == 0x168) {
            timedGetcRaw::extKey = 5;
          }
          else if ((local_4 < 0) || (0xff < local_4)) {
            return 0x20;
          }
        }
      }
    }
  }
  if (timedGetcRaw::extKey != 0) {
    timedGetcRaw::done = false;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
timedGetcRaw( bool showCursor, int timeout = -1, bool* timedOut = 0)
{
    // If `done' is false, it means that we have been previously
    // called and returned 0, so this time we should return the
    // extended key-code we stored last time in `extKey'.
    static bool done = true;
    static int extKey;

    if (not done) {
        // We have a pending return from our last call.  Prepare to do a
        // normal read on our next call and return the pending result.
        done = true;
        return extKey;
    }

    // Read a character.
    int c = globalApp->getRawChar(showCursor, timeout);
    extKey = 0;

    if (c == ERR) {
        if (timeout > -1) {
            // The operation timed out.
            if (timedOut != 0) *timedOut = true;
            return 0;
        }
        // Paranoia (ERR is only returned to indicate that the operation
        // timed out).  Something else happened.  Prepare to return an EOF
        // on our next call.
        extKey = CMD_EOF;
    }

    // If a timeout was specified and the caller wants to know, report that
    // no timeout occured.
    if (timeout > -1 and timedOut != 0) *timedOut = false;
        
    switch (c) {
      // Paranoia.
      // ERR should always be 0, and therefore already handled.  Anyway, we
      // explicitly check for 0 here just in case ERR != 0.
      case 0:         extKey = CMD_EOF; break;
      // A Tab is not an extended character, but Tads requires that it is
      // handled as one.
      case '\t':      extKey = CMD_TAB; break;
      case '\n':
      case '\r':
      case KEY_ENTER: return 13;
      case KEY_DOWN:  extKey = CMD_DOWN; break;
      case KEY_UP:    extKey = CMD_UP; break;
      case KEY_LEFT:  extKey = CMD_LEFT; break;
      case KEY_RIGHT: extKey = CMD_RIGHT; break;
      case KEY_HOME:  extKey = CMD_HOME; break;
      // We don't return '\b' because of paranoia; some systems might not
      // use ASCII code 8 for '\b'.
      case '\b':
      case KEY_BACKSPACE: return 8;
      case KEY_F(1):  extKey = CMD_F1; break;
      case KEY_F(2):  extKey = CMD_F2; break;
      case KEY_F(3):  extKey = CMD_F3; break;
      case KEY_F(4):  extKey = CMD_F4; break;
      case KEY_F(5):  extKey = CMD_F5; break;
      case KEY_F(6):  extKey = CMD_F6; break;
      case KEY_F(7):  extKey = CMD_F7; break;
      case KEY_F(8):  extKey = CMD_F8; break;
      case KEY_F(9):  extKey = CMD_F9; break;
      case KEY_F(10): extKey = CMD_F10; break;
      case KEY_DL:    extKey = CMD_KILL; break;
      case KEY_DC:    extKey = CMD_DEL; break;
      case KEY_EOL:   extKey = CMD_DEOL; break;
      case KEY_NPAGE: extKey = CMD_PGDN; break;
      case KEY_PPAGE: extKey = CMD_PGUP; break;
      case KEY_END:   extKey = CMD_END; break;
      default:
        // TODO: This assumes that the system only returns unsigned
        // characters for "normal" inputs.
        if (c < 0 or c > 255) {
            // Who knows?  Report a space so that there's at least some
            // feedback.
            return ' ';
        }
    }

    if (extKey == 0) {
        // It's a normal ASCII code (this includes Escape, which has code
        // 27).
        return c;
    }

    // Prepare to return the extended key-code on our next call.
    done = false;
    return 0;
}